

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int __thiscall
Player::executeAttack
          (Player *this,Country *fromCountry,Country *toCountry,Player *defendingPlayer,
          int numAttackingDice,int numDefendingDice)

{
  pointer *this_00;
  bool bVar1;
  byte bVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  DiceRoller *pDVar6;
  ostream *poVar7;
  reference pvVar8;
  GameLoop *this_01;
  Deck *this_02;
  Hand *userHand;
  bool local_201;
  byte local_129;
  int newArmies;
  value_type local_c0;
  value_type local_bc;
  int dRoll;
  int aRoll;
  string local_98;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> defendingRolls;
  vector<int,_std::allocator<int>_> attackingRolls;
  int numDefendingDice_local;
  int numAttackingDice_local;
  Player *defendingPlayer_local;
  Country *toCountry_local;
  Country *fromCountry_local;
  Player *this_local;
  
  pDVar6 = getDiceRoller(this);
  DiceRoller::roll((vector<int,_std::allocator<int>_> *)
                   &defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pDVar6,numAttackingDice);
  pDVar6 = getDiceRoller(defendingPlayer);
  DiceRoller::roll((vector<int,_std::allocator<int>_> *)local_68,pDVar6,numDefendingDice);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7," - ");
  Map::Country::getCountryName_abi_cxx11_(&local_98,fromCountry);
  poVar7 = std::operator<<(poVar7,(string *)&local_98);
  poVar7 = std::operator<<(poVar7," is attacking ");
  Map::Country::getCountryName_abi_cxx11_((string *)&dRoll,toCountry);
  poVar7 = std::operator<<(poVar7,(string *)&dRoll);
  poVar7 = std::operator<<(poVar7," - ");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&dRoll);
  std::__cxx11::string::~string((string *)&local_98);
  do {
    while( true ) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)
                         &defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      local_129 = 0;
      if (!bVar1) {
        bVar1 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)local_68);
        local_129 = bVar1 ^ 0xff;
      }
      if ((local_129 & 1) == 0) {
        setPlayerState(this,IDLE);
        this_local._4_4_ = 1;
        goto LAB_00114092;
      }
      this_00 = &defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar8 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)this_00);
      local_bc = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)local_68);
      local_c0 = *pvVar8;
      std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)this_00)
      ;
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)local_68);
      poVar7 = std::operator<<((ostream *)&std::cout,"\nAttacker rolled a ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_bc);
      poVar7 = std::operator<<(poVar7,". Defender rolled a ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_c0);
      poVar7 = std::operator<<(poVar7,".");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      if (local_c0 < local_bc) break;
      poVar7 = std::operator<<((ostream *)&std::cout,"\nAttacker lost 1 army!");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      iVar4 = Map::Country::getNumberOfTroops(fromCountry);
      Map::Country::setNumberOfTroops(fromCountry,iVar4 + -1);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"\n[DEFENDER] Defender lost 1 army!");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar4 = Map::Country::getNumberOfTroops(toCountry);
    Map::Country::setNumberOfTroops(toCountry,iVar4 + -1);
    iVar4 = Map::Country::getNumberOfTroops(toCountry);
  } while (iVar4 != 0);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "\n[DEFENDER] Defender has lost possession of country ");
  Map::Country::getCountryName_abi_cxx11_((string *)&newArmies,toCountry);
  poVar7 = std::operator<<(poVar7,(string *)&newArmies);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&newArmies);
  bVar1 = exchangeCountryOwnership(this,defendingPlayer,toCountry);
  if (bVar1) {
    do {
      this_01 = GameLoop::getInstance();
      this_02 = GameLoop::getGameDeck(this_01);
      userHand = getCards(this);
      Deck::draw(this_02,userHand);
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "\n[ATTACKER] How many armies do you want to place on your new country?(1 to "
                              );
      iVar4 = Map::Country::getNumberOfTroops(fromCountry);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4 + -1);
      std::operator<<(poVar7,")");
      iVar4 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,4);
      iVar5 = Map::Country::getNumberOfTroops(fromCountry);
      if ((((iVar4 <= iVar5 + -1) && (0 < iVar4)) && (bVar2 = std::ios::fail(), (bVar2 & 1) == 0))
         && (_Var3 = std::isnan<int>(iVar4), !_Var3)) {
        iVar5 = Map::Country::getNumberOfTroops(fromCountry);
        Map::Country::setNumberOfTroops(fromCountry,iVar5 - iVar4);
        Map::Country::setNumberOfTroops(toCountry,iVar4);
        break;
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"\nInvalid number! Try again.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      iVar5 = Map::Country::getNumberOfTroops(fromCountry);
      local_201 = iVar5 + -1 < iVar4 || iVar4 < 1;
    } while (local_201);
    setPlayerState(this,IDLE);
    this_local._4_4_ = 1;
  }
  else {
    setPlayerState(this,IDLE);
    this_local._4_4_ = -1;
  }
LAB_00114092:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &defendingRolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
}

Assistant:

int
Player::executeAttack(Map::Country *fromCountry, Map::Country *toCountry, Player *defendingPlayer, int numAttackingDice,
                      int numDefendingDice) {
    /*
     * 1. The attacking player rolls 1-3 dice, having +1 army than dice rolled. 1 dice roll per attacking army.
     * 2. Defender rolls 2 dice, 1 for each army defending
     * 3. Compare highest dice rolls per army, defender wins ties. lower number loses army
     * 4. If the defending country loses all its armies, the attacking country has to place
     * at least 1 of the attacking armies on the conquered country, up to all but one army
     */

    // Roll
    std::vector<int> attackingRolls = this->getDiceRoller()->roll(numAttackingDice);
    std::vector<int> defendingRolls = defendingPlayer->getDiceRoller()->roll(numDefendingDice);
    std::cout << std::endl << " - " << fromCountry->getCountryName() << " is attacking " << toCountry->getCountryName() << " - "<<std::endl;

    // Compare the rolls, decide who wins and change number of armies of each country. Maybe update if attacking wins
    while (!attackingRolls.empty() && !defendingRolls.empty()) {
        int aRoll = attackingRolls.back();
        int dRoll = defendingRolls.back();
        attackingRolls.pop_back();
        defendingRolls.pop_back();
        std::cout << "\nAttacker rolled a " << aRoll << ". Defender rolled a " << dRoll << "." << std::endl;
        if (aRoll > dRoll) {
            // defender loses 1 army
            std::cout << "\n[DEFENDER] Defender lost 1 army!" << std::endl;
            toCountry->setNumberOfTroops(toCountry->getNumberOfTroops() - 1);
            // then, if no armies left on defending country, attacking player conquers it
            if (toCountry->getNumberOfTroops() == 0) {
                std::cout << "\n[DEFENDER] Defender has lost possession of country " << toCountry->getCountryName()
                          << std::endl;
                if (!exchangeCountryOwnership(*this, defendingPlayer, *toCountry)) {
                    this->setPlayerState(PlayerState::IDLE);
                    return PlayerAction::FAILED;
                } else {
                    int newArmies = 0;
                    do {
                        GameLoop::getInstance()->getGameDeck()->draw(*this->getCards());
                        cout << "\n[ATTACKER] How many armies do you want to place on your new country?(1 to "
                             << fromCountry->getNumberOfTroops() - 1 << ")";
                        newArmies = strategy->intInput(StrategyContext::ATTACK_NEW_ARMY_COUNT);
                        if (newArmies > fromCountry->getNumberOfTroops() - 1 || newArmies < 1 || cin.fail() || isnan(newArmies)) {
                            cout << "\nInvalid number! Try again." << std::endl;
                            continue;
                        } else {
                            fromCountry->setNumberOfTroops(fromCountry->getNumberOfTroops() - newArmies);
                            toCountry->setNumberOfTroops(newArmies);
                            break;
                        }
                    } while (newArmies > fromCountry->getNumberOfTroops() - 1 || newArmies < 1);
                    this->setPlayerState(PlayerState::IDLE);
                    return PlayerAction::SUCCEEDED;
                }
            }
        } else {
            // attacker loses 1 army
            std::cout << "\nAttacker lost 1 army!" << std::endl;
            fromCountry->setNumberOfTroops(fromCountry->getNumberOfTroops() - 1);
        }
    }
    this->setPlayerState(PlayerState::IDLE);
    return PlayerAction::SUCCEEDED;
}